

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcolu.c
# Opt level: O1

int ffpcluc(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem,
           int *status)

{
  int iVar1;
  size_t sVar2;
  char *err_message;
  long lVar3;
  long lVar4;
  long lVar5;
  uchar lognul;
  uchar i1null;
  short i2null;
  int tcode;
  long local_158;
  LONGLONG elemnum;
  char *local_148;
  uint local_13c;
  int i4null;
  int hdutype;
  long local_130;
  LONGLONG repeat;
  long twidth;
  LONGLONG rowlen;
  LONGLONG startpos;
  LONGLONG i8null;
  LONGLONG tnull;
  long incre;
  int maxelem;
  char snull [20];
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  double zero;
  double scale;
  char tform [20];
  char message [81];
  
  lognul = '\0';
  local_c8 = 0xffffffff;
  uStack_c4 = 0xffffffff;
  uStack_c0 = 0xffffffff;
  uStack_bc = 0xffffffff;
  if (0 < *status) {
    return *status;
  }
  local_158 = nelem;
  ffgtcl(fptr,colnum,&tcode,(long *)0x0,(long *)0x0,status);
  lVar5 = local_158;
  iVar1 = ffgcprll(fptr,colnum,firstrow,firstelem,local_158,(uint)~tcode >> 0x1e & 0xfffffffe,&scale
                   ,&zero,tform,&twidth,&tcode,&maxelem,&startpos,&elemnum,&incre,&repeat,&rowlen,
                   &hdutype,&tnull,snull,status);
  if (0 < iVar1) goto LAB_001a73b5;
  local_148 = (char *)0x0;
  local_13c = colnum;
  if (tcode < 0x15) {
    if (tcode == 0xb) goto LAB_001a7416;
    if (tcode == 0x10) {
      if (snull[0] == '\x01') {
        err_message = "Null value string for ASCII table column is not defined (FTPCLU).";
        goto LAB_001a742b;
      }
      sVar2 = 0x14;
      if (0x14 < twidth) {
        sVar2 = twidth;
      }
      local_148 = (char *)malloc(sVar2);
      if (local_148 == (char *)0x0) {
        *status = 0x71;
        return 0x71;
      }
      memset(local_148,0x20,sVar2);
      sVar2 = strlen(snull);
      strncpy(local_148,snull,(long)(int)((uint)(hdutype == 2) + (int)sVar2));
    }
  }
  else if (((tcode == 0x15) || (tcode == 0x29)) || (tcode == 0x51)) {
LAB_001a7416:
    if (tnull == 0x4995cdd1) {
      err_message = "Null value for integer table column is not defined (FTPCLU).";
LAB_001a742b:
      ffpmsg(err_message);
      *status = 0x13a;
      return 0x13a;
    }
    if (tcode == 0x29) {
      i4null = (int)tnull;
      ffswap4(&i4null,1);
    }
    else if (tcode == 0x15) {
      i2null = (short)tnull;
      ffswap2(&i2null,1);
    }
    else if (tcode == 0xb) {
      i1null = (uchar)tnull;
    }
    else {
      i8null = tnull;
      ffswap8((double *)&i8null,1);
    }
    local_148 = (char *)0x0;
  }
  if (lVar5 != 0) {
    local_130 = 0;
    local_158 = 0;
    do {
      lVar3 = repeat - elemnum;
      if (lVar5 < repeat - elemnum) {
        lVar3 = lVar5;
      }
      ffmbyt(fptr,elemnum * incre + rowlen * local_158 + startpos,1,status);
      if (tcode < 0x29) {
        if (tcode < 0x10) {
          if (tcode == 0xb) {
            lVar4 = lVar3;
            if (0 < lVar3) {
              do {
                ffpbyt(fptr,1,&i1null,status);
                lVar4 = lVar4 + -1;
              } while (lVar4 != 0);
            }
          }
          else {
            if (tcode != 0xe) {
LAB_001a7779:
              snprintf(message,0x51,"Cannot write null value to column %d which has format %s",
                       (ulong)local_13c,tform);
              ffpmsg(message);
              goto LAB_001a73b5;
            }
            lVar4 = lVar3;
            if (0 < lVar3) {
              do {
                ffpbyt(fptr,1,&lognul,status);
                lVar4 = lVar4 + -1;
              } while (lVar4 != 0);
            }
          }
        }
        else if (tcode == 0x10) {
          ffpbyt(fptr,twidth,local_148,status);
        }
        else {
          if (tcode != 0x15) goto LAB_001a7779;
          lVar4 = lVar3;
          if (0 < lVar3) {
            do {
              ffpbyt(fptr,2,&i2null,status);
              lVar4 = lVar4 + -1;
            } while (lVar4 != 0);
          }
        }
      }
      else if (tcode < 0x51) {
        if (tcode == 0x29) {
          lVar4 = lVar3;
          if (0 < lVar3) {
            do {
              ffpbyt(fptr,4,&i4null,status);
              lVar4 = lVar4 + -1;
            } while (lVar4 != 0);
          }
        }
        else {
          if (tcode != 0x2a) goto LAB_001a7779;
          lVar4 = lVar3;
          if (0 < lVar3) {
            do {
              ffpbyt(fptr,4,&local_c8,status);
              lVar4 = lVar4 + -1;
            } while (lVar4 != 0);
          }
        }
      }
      else if (tcode == 0x51) {
        lVar4 = lVar3;
        if (0 < lVar3) {
          do {
            ffpbyt(fptr,8,&i8null,status);
            lVar4 = lVar4 + -1;
          } while (lVar4 != 0);
        }
      }
      else {
        if (tcode != 0x52) goto LAB_001a7779;
        lVar4 = lVar3;
        if (0 < lVar3) {
          do {
            ffpbyt(fptr,8,&local_c8,status);
            lVar4 = lVar4 + -1;
          } while (lVar4 != 0);
        }
      }
      if (0 < *status) {
        snprintf(message,0x51,"Error writing %.0f thru %.0f of null values (ffpclu).",
                 SUB84((double)(local_130 + 1),0),(double)(lVar3 + local_130));
        ffpmsg(message);
        break;
      }
      lVar5 = lVar5 - lVar3;
      if (lVar5 != 0) {
        local_130 = local_130 + lVar3;
        elemnum = lVar3 + elemnum;
        if (elemnum == repeat) {
          elemnum = 0;
          local_158 = local_158 + 1;
        }
      }
    } while (lVar5 != 0);
  }
  if (local_148 != (char *)0x0) {
    free(local_148);
  }
LAB_001a73b5:
  return *status;
}

Assistant:

int ffpcluc( fitsfile *fptr,  /* I - FITS file pointer                       */
            int  colnum,     /* I - number of column to write (1 = 1st col) */
            LONGLONG  firstrow,  /* I - first row to write (1 = 1st row)        */
            LONGLONG  firstelem, /* I - first vector element to write (1 = 1st) */
            LONGLONG  nelem,     /* I - number of values to write               */
            int  *status)    /* IO - error status                           */
/*
  Set elements of a table column to the appropriate null value for the column
  The column number may refer to a real column in an ASCII or binary table, 
  or it may refer to a virtual column in a 1 or more grouped FITS primary
  array.  FITSIO treats a primary array as a binary table
  with 2 vector columns: the first column contains the group parameters (often
  with length = 0) and the second column contains the array of image pixels.
  Each row of the table represents a group in the case of multigroup FITS
  images.
  
  This routine does not do anything special in the case of COMPLEX table columns
  (unlike the similar ffpclu routine).  This routine is mainly for use by
  ffpcne which already compensates for the effective doubling of the number of 
  elements in a complex column.
*/
{
    int tcode, maxelem, hdutype, writemode = 2, leng;
    short i2null;
    INT32BIT i4null;
    long twidth, incre;
    LONGLONG ii;
    LONGLONG tnull, i8null;
    LONGLONG repeat, startpos, elemnum, wrtptr, rowlen, rownum, remain, next, ntodo;
    double scale, zero;
    unsigned char i1null, lognul = 0;
    char tform[20], *cstring = 0;
    char message[FLEN_ERRMSG];
    char snull[20];   /*  the FITS null value  */
    long   jbuff[2] = { -1, -1};  /* all bits set is equivalent to a NaN */
    size_t buffsize;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /*---------------------------------------------------*/
    /*  Check input and get parameters about the column: */
    /*---------------------------------------------------*/

    /* note that writemode = 2 by default (not 1), so that the returned */
    /* repeat and incre values will be the actual values for this column. */

    /* If writing nulls to a variable length column then dummy data values  */
    /* must have already been written to the heap. */
    /* We just have to overwrite the previous values with null values. */
    /* Set writemode = 0 in this case, to test that values have been written */

    fits_get_coltype(fptr, colnum, &tcode, NULL, NULL, status);
    if (tcode < 0)
         writemode = 0;  /* this is a variable length column */
    
    if (ffgcprll( fptr, colnum, firstrow, firstelem, nelem, writemode, &scale,
       &zero, tform, &twidth, &tcode, &maxelem, &startpos,  &elemnum, &incre,
        &repeat, &rowlen, &hdutype, &tnull, snull, status) > 0)
        return(*status);

    if (tcode == TSTRING)
    {
      if (snull[0] == ASCII_NULL_UNDEFINED)
      {
        ffpmsg(
        "Null value string for ASCII table column is not defined (FTPCLU).");
        return(*status = NO_NULL);
      }

      /* allocate buffer to hold the null string.  Must write the entire */
      /* width of the column (twidth bytes) to avoid possible problems */
      /* with uninitialized FITS blocks, in case the field spans blocks */

      buffsize = maxvalue(20, twidth);
      cstring = (char *) malloc(buffsize);
      if (!cstring)
         return(*status = MEMORY_ALLOCATION);

      memset(cstring, ' ', buffsize);  /* initialize  with blanks */

      leng = strlen(snull);
      if (hdutype == BINARY_TBL)
         leng++;        /* copy the terminator too in binary tables */

      strncpy(cstring, snull, leng);  /* copy null string to temp buffer */

    }
    else if ( tcode == TBYTE  ||
              tcode == TSHORT ||
              tcode == TLONG  ||
              tcode == TLONGLONG) 
    {
      if (tnull == NULL_UNDEFINED)
      {
        ffpmsg(
        "Null value for integer table column is not defined (FTPCLU).");
        return(*status = NO_NULL);
      }

      if (tcode == TBYTE)
         i1null = (unsigned char) tnull;
      else if (tcode == TSHORT)
      {
         i2null = (short) tnull;
#if BYTESWAPPED
         ffswap2(&i2null, 1); /* reverse order of bytes */
#endif
      }
      else if (tcode == TLONG)
      {
         i4null = (INT32BIT) tnull;
#if BYTESWAPPED
         ffswap4(&i4null, 1); /* reverse order of bytes */
#endif
      }
      else
      {
         i8null = tnull;
#if BYTESWAPPED
         ffswap8((double *)(&i8null), 1);  /* reverse order of bytes */
#endif
      }
    }

    /*---------------------------------------------------------------------*/
    /*  Now write the pixels to the FITS column.                           */
    /*---------------------------------------------------------------------*/
    remain = nelem;           /* remaining number of values to write  */
    next = 0;                 /* next element in array to be written  */
    rownum = 0;               /* row number, relative to firstrow     */
    ntodo = remain;           /* number of elements to write at one time */

    while (ntodo)
    {
        /* limit the number of pixels to process at one time to the number that
           will fit in the buffer space or to the number of pixels that remain
           in the current vector, which ever is smaller.
        */
        ntodo = minvalue(ntodo, (repeat - elemnum));
        wrtptr = startpos + ((LONGLONG)rownum * rowlen) + (elemnum * incre);

        ffmbyt(fptr, wrtptr, IGNORE_EOF, status); /* move to write position */

        switch (tcode) 
        {
            case (TBYTE):
 
                for (ii = 0; ii < ntodo; ii++)
                  ffpbyt(fptr, 1,  &i1null, status);
                break;

            case (TSHORT):

                for (ii = 0; ii < ntodo; ii++)
                  ffpbyt(fptr, 2, &i2null, status);
                break;

            case (TLONG):

                for (ii = 0; ii < ntodo; ii++)
                  ffpbyt(fptr, 4, &i4null, status);
                break;

            case (TLONGLONG):

                for (ii = 0; ii < ntodo; ii++)
                  ffpbyt(fptr, 8, &i8null, status);
                break;

            case (TFLOAT):

                for (ii = 0; ii < ntodo; ii++)
                  ffpbyt(fptr, 4, jbuff, status);
                break;

            case (TDOUBLE):

                for (ii = 0; ii < ntodo; ii++)
                  ffpbyt(fptr, 8, jbuff, status);
                break;

            case (TLOGICAL):
 
                for (ii = 0; ii < ntodo; ii++)
                  ffpbyt(fptr, 1, &lognul, status);
                break;

            case (TSTRING):  /* an ASCII table column */
                /* repeat always = 1, so ntodo is also guaranteed to = 1 */
                ffpbyt(fptr, twidth, cstring, status);
                break;

            default:  /*  error trap  */
                snprintf(message, FLEN_ERRMSG,
                   "Cannot write null value to column %d which has format %s",
                     colnum,tform);
                ffpmsg(message);
                return(*status);

        } /* End of switch block */

        /*-------------------------*/
        /*  Check for fatal error  */
        /*-------------------------*/
        if (*status > 0)  /* test for error during previous write operation */
        {
           snprintf(message,FLEN_ERRMSG,
             "Error writing %.0f thru %.0f of null values (ffpclu).",
              (double) (next+1), (double) (next+ntodo));
           ffpmsg(message);

           if (cstring)
              free(cstring);

           return(*status);
        }

        /*--------------------------------------------*/
        /*  increment the counters for the next loop  */
        /*--------------------------------------------*/
        remain -= ntodo;
        if (remain)
        {
            next += ntodo;
            elemnum += ntodo;
            if (elemnum == repeat)  /* completed a row; start on next row */
            {
                elemnum = 0;
                rownum++;
            }
        }
        ntodo = remain;  /* this is the maximum number to do in next loop */

    }  /*  End of main while Loop  */

    if (cstring)
       free(cstring);

    return(*status);
}